

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

void __thiscall
spvtools::opt::BasicBlock::ForMergeAndContinueLabel
          (BasicBlock *this,function<void_(unsigned_int)> *f)

{
  bool bVar1;
  Op OVar2;
  Instruction *pIVar3;
  anon_class_8_1_54a39806 local_50;
  function<void_(unsigned_int_*)> local_48;
  undefined1 local_28 [16];
  iterator ii;
  function<void_(unsigned_int)> *f_local;
  BasicBlock *this_local;
  
  ii.super_iterator.node_ = (iterator)(iterator)f;
  InstructionList::end((InstructionList *)(local_28 + 8));
  InstructionList::iterator::operator--((iterator *)(local_28 + 8));
  InstructionList::begin((InstructionList *)local_28);
  bVar1 = utils::operator==((iterator_template<spvtools::opt::Instruction> *)(local_28 + 8),
                            (iterator_template<spvtools::opt::Instruction> *)local_28);
  if (!bVar1) {
    InstructionList::iterator::operator--((iterator *)(local_28 + 8));
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)(local_28 + 8));
    OVar2 = opt::Instruction::opcode(pIVar3);
    if (OVar2 != OpSelectionMerge) {
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_28 + 8));
      OVar2 = opt::Instruction::opcode(pIVar3);
      if (OVar2 != OpLoopMerge) {
        return;
      }
    }
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)(local_28 + 8));
    local_50.f = (function<void_(unsigned_int)> *)ii.super_iterator.node_;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::BasicBlock::ForMergeAndContinueLabel(std::function<void(unsigned_int)>const&)::__0,void>
              ((function<void(unsigned_int*)> *)&local_48,&local_50);
    opt::Instruction::ForEachInId(pIVar3,&local_48);
    std::function<void_(unsigned_int_*)>::~function(&local_48);
  }
  return;
}

Assistant:

void BasicBlock::ForMergeAndContinueLabel(
    const std::function<void(const uint32_t)>& f) {
  auto ii = insts_.end();
  --ii;
  if (ii == insts_.begin()) return;
  --ii;
  if (ii->opcode() == spv::Op::OpSelectionMerge ||
      ii->opcode() == spv::Op::OpLoopMerge) {
    ii->ForEachInId([&f](const uint32_t* idp) { f(*idp); });
  }
}